

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O2

int __thiscall Fl_Type::msgnum(Fl_Type *this)

{
  Fl_Type *pFVar1;
  int iVar2;
  Fl_Type *pFVar3;
  int iVar4;
  
  iVar4 = 0;
  pFVar1 = this;
  while (pFVar3 = pFVar1, pFVar3 != (Fl_Type *)0x0) {
    iVar4 = (iVar4 + 1) - (uint)(pFVar3->label_ == (char *)0x0);
    if (pFVar3 != this) {
      iVar2 = (*pFVar3->_vptr_Fl_Type[0x17])(pFVar3);
      if (iVar2 != 0) {
        iVar4 = (iVar4 + 1) - (uint)(pFVar3[1].user_data_type_ == (char *)0x0);
      }
    }
    pFVar1 = pFVar3->prev;
    if (pFVar3->prev == (Fl_Type *)0x0) {
      pFVar1 = pFVar3->parent;
    }
  }
  return iVar4;
}

Assistant:

int
Fl_Type::msgnum() {
  int		count;
  Fl_Type	*p;

  for (count = 0, p = this; p;) {
    if (p->label()) count ++;
    if (p != this && p->is_widget() && ((Fl_Widget_Type *)p)->tooltip()) count ++;

    if (p->prev) p = p->prev;
    else p = p->parent;
  }

  return count;
}